

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void LogTextV(ImGuiContext_conflict1 *g,char *fmt,__va_list_tag *args)

{
  int *piVar1;
  int iVar2;
  char *pcVar3;
  int iVar4;
  char *pcVar5;
  
  if (g->LogFile != (ImFileHandle)0x0) {
    if ((g->LogBuffer).Buf.Capacity < 0) {
      if (GImGui != (ImGuiContext_conflict1 *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      pcVar5 = (char *)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
      pcVar3 = (g->LogBuffer).Buf.Data;
      if (pcVar3 != (char *)0x0) {
        memcpy(pcVar5,pcVar3,(long)(g->LogBuffer).Buf.Size);
        pcVar3 = (g->LogBuffer).Buf.Data;
        if ((pcVar3 != (char *)0x0) && (GImGui != (ImGuiContext_conflict1 *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pcVar3,GImAllocatorUserData);
      }
      (g->LogBuffer).Buf.Data = pcVar5;
      (g->LogBuffer).Buf.Capacity = 0;
    }
    (g->LogBuffer).Buf.Size = 0;
    ImGuiTextBuffer::appendfv(&g->LogBuffer,fmt,args);
    pcVar3 = (g->LogBuffer).Buf.Data;
    pcVar5 = ImGuiTextBuffer::EmptyString;
    if (pcVar3 != (char *)0x0) {
      pcVar5 = pcVar3;
    }
    iVar2 = (g->LogBuffer).Buf.Size;
    iVar4 = iVar2 + -1;
    if (iVar2 == 0) {
      iVar4 = 0;
    }
    fwrite(pcVar5,1,(long)iVar4,(FILE *)g->LogFile);
    return;
  }
  ImGuiTextBuffer::appendfv(&g->LogBuffer,fmt,args);
  return;
}

Assistant:

static inline void LogTextV(ImGuiContext& g, const char* fmt, va_list args)
{
    if (g.LogFile)
    {
        g.LogBuffer.Buf.resize(0);
        g.LogBuffer.appendfv(fmt, args);
        ImFileWrite(g.LogBuffer.c_str(), sizeof(char), (ImU64)g.LogBuffer.size(), g.LogFile);
    }
    else
    {
        g.LogBuffer.appendfv(fmt, args);
    }
}